

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

int json_print_string(lyout *out,char *text)

{
  byte bVar1;
  int iVar2;
  int local_28;
  uint uStack_24;
  uchar ascii;
  uint n;
  uint i;
  char *text_local;
  lyout *out_local;
  
  if (text == (char *)0x0) {
    out_local._4_4_ = 0;
  }
  else {
    ly_write(out,"\"",1);
    local_28 = 0;
    for (uStack_24 = 0; text[uStack_24] != '\0'; uStack_24 = uStack_24 + 1) {
      bVar1 = text[uStack_24];
      if (bVar1 < 0x20) {
        iVar2 = ly_print(out,"\\u%.4X",(ulong)bVar1);
        local_28 = iVar2 + local_28;
      }
      else if (bVar1 == 0x22) {
        iVar2 = ly_print(out,"\\\"");
        local_28 = iVar2 + local_28;
      }
      else if (bVar1 == 0x5c) {
        iVar2 = ly_print(out,"\\\\");
        local_28 = iVar2 + local_28;
      }
      else {
        ly_write(out,text + uStack_24,1);
        local_28 = local_28 + 1;
      }
    }
    ly_write(out,"\"",1);
    out_local._4_4_ = local_28 + 2;
  }
  return out_local._4_4_;
}

Assistant:

int
json_print_string(struct lyout *out, const char *text)
{
    unsigned int i, n;

    if (!text) {
        return 0;
    }

    ly_write(out, "\"", 1);
    for (i = n = 0; text[i]; i++) {
        const unsigned char ascii = text[i];
        if (ascii < 0x20) {
            /* control character */
            n += ly_print(out, "\\u%.4X", ascii);
        } else {
            switch (ascii) {
            case '"':
                n += ly_print(out, "\\\"");
                break;
            case '\\':
                n += ly_print(out, "\\\\");
                break;
            default:
                ly_write(out, &text[i], 1);
                n++;
            }
        }
    }
    ly_write(out, "\"", 1);

    return n + 2;
}